

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::BackgroundMarkWeakRefs(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Type *pTVar5;
  HeapBlock *pHVar6;
  void *candidate;
  Type pRVar7;
  Type TVar8;
  undefined8 *in_FS_OFFSET;
  Iterator local_40;
  
  local_40.list =
       &(this->weakReferenceRegionList).
        super_SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  local_40.current = &(local_40.list)->super_SListNodeBase<Memory::HeapAllocator>;
  do {
    if ((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
        local_40.current ==
        (SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    local_40.current =
         (((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
          &((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
           local_40.current)->super_SListNodeBase<Memory::HeapAllocator>)->
         super_SListNodeBase<Memory::HeapAllocator>).next;
    if ((SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount> *)
        local_40.current == local_40.list) {
      return;
    }
    pTVar5 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
             Iterator::Data(&local_40);
    TVar8 = pTVar5->count;
    pRVar7 = pTVar5->ptr + 8;
    while (bVar3 = TVar8 != 0, TVar8 = TVar8 - 1, bVar3) {
      candidate = *(void **)(pRVar7 + -8);
      if ((candidate != (void *)0x0) && (pHVar6 = *(HeapBlock **)pRVar7, ((ulong)pHVar6 & 1) == 0))
      {
        if (pHVar6 == (HeapBlock *)0x0) {
          pHVar6 = FindHeapBlock(this,candidate);
          *(HeapBlock **)pRVar7 = pHVar6;
          if (pHVar6 == (HeapBlock *)0x0) goto LAB_0028f32c;
          candidate = *(void **)(pRVar7 + -8);
        }
        iVar4 = (*pHVar6->_vptr_HeapBlock[0xb])(pHVar6,candidate);
        if ((char)iVar4 != '\0') {
          *pRVar7 = (RecyclerWeakReferenceRegionItem<void_*>)((byte)*pRVar7 | 1);
        }
      }
LAB_0028f32c:
      pRVar7 = pRVar7 + 0x10;
    }
  } while( true );
}

Assistant:

void
Recycler::BackgroundMarkWeakRefs()
{
#if ENABLE_WEAK_REFERENCE_REGIONS
    auto iterator = this->weakReferenceRegionList.GetIterator();
    while (iterator.Next())
    {
        RecyclerWeakReferenceRegion region = iterator.Data();
        RecyclerWeakReferenceRegionItem<void*> *items = region.GetPtr();
        size_t count = region.GetCount();
        for (size_t index = 0; index < count; ++index)
        {
            RecyclerWeakReferenceRegionItem<void*> &item = items[index];
            if (item.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)item.heapBlock & 0x1) == 0x1)
            {
                // This weak reference is already marked
                continue;
            }

            if (item.heapBlock == nullptr)
            {
                item.heapBlock = this->FindHeapBlock(item.ptr);
                if (item.heapBlock == nullptr)
                {
                    // This isn't a real weak reference, ignore it
                    continue;
                }
            }

            if (item.heapBlock->TestObjectMarkedBit(item.ptr))
            {
                item.heapBlock = (HeapBlock*) ((uintptr_t)item.heapBlock | 0x1);
            }
        }
    }
#endif
}